

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

Builder * embree::sse2::BVH4VirtualMeshBuilderMortonGeneral
                    (void *bvh,UserGeometry *mesh,uint geomID,size_t mode)

{
  BVHNMeshBuilderMorton<4,_embree::UserGeometry,_embree::Object> *this;
  
  this = (BVHNMeshBuilderMorton<4,_embree::UserGeometry,_embree::Object> *)::operator_new(0x78);
  BVHNMeshBuilderMorton<4,_embree::UserGeometry,_embree::Object>::BVHNMeshBuilderMorton
            (this,(BVH *)bvh,mesh,geomID,1,7,0x400);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4VirtualMeshBuilderMortonGeneral (void* bvh, UserGeometry* mesh, unsigned int geomID, size_t mode) { return new class BVHNMeshBuilderMorton<4,UserGeometry,Object>((BVH4*)bvh,mesh,geomID,1,BVH4::maxLeafBlocks); }